

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroup_controller.cpp
# Opt level: O2

void __thiscall CgroupController::~CgroupController(CgroupController *this)

{
  pointer pcVar1;
  ContextManager *pCVar2;
  error_code error;
  error_code local_68;
  undefined8 local_58 [4];
  string local_38;
  
  if (this->enter_fd_ != -1) {
    close_enter_fd(this);
  }
  local_68._M_value = 0;
  local_68._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::remove(&this->path_,&local_68);
  if (local_68._M_value != 0) {
    pCVar2 = ContextManager::get();
    pcVar1 = (this->path_)._M_pathname._M_dataplus._M_p;
    (**(code **)(*(long *)local_68._M_cat + 0x20))(local_58,local_68._M_cat,local_68._M_value);
    format_abi_cxx11_(&local_38,"Cannot remove dir \'%s\': %s",pcVar1,local_58[0]);
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)local_58);
  }
  std::filesystem::__cxx11::path::~path(&this->path_);
  return;
}

Assistant:

CgroupController::~CgroupController() {
    if (enter_fd_ != -1) close_enter_fd();
    std::error_code error;
    fs::remove(path_, error);
    if (error) {
        die(format("Cannot remove dir '%s': %s", path_.c_str(), error.message().c_str()));
    }
}